

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_Null(void)

{
  Task *in_RDI;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"null",&local_31);
  Task::Task(in_RDI,&local_30,Simple);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

Task create_Null()
	{
		Task null {"null"};

		return null;
	}